

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_returnBoolValue_Test::testBody(TEST_MockSupport_c_returnBoolValue_Test *this)

{
  int iVar1;
  int iVar2;
  MockSupport_c *pMVar3;
  MockExpectedCall_c *pMVar4;
  MockActualCall_c *pMVar5;
  UtestShell *pUVar6;
  TestTerminator *pTVar7;
  char *pcVar8;
  char *pcVar9;
  MockValue_c MVar10;
  SimpleString local_40;
  SimpleString local_30;
  
  pMVar3 = mock_c();
  pMVar4 = (*pMVar3->expectOneCall)("boo");
  (*pMVar4->andReturnBoolValue)(1);
  pMVar3 = mock_c();
  pMVar5 = (*pMVar3->actualCall)("boo");
  iVar1 = (*pMVar5->boolReturnValue)();
  if (iVar1 == 1) {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0xf6,pTVar7);
  }
  else {
    pMVar3 = mock_c();
    pMVar5 = (*pMVar3->actualCall)("boo");
    iVar1 = (*pMVar5->boolReturnValue)();
    pMVar3 = mock_c();
    pMVar5 = (*pMVar3->actualCall)("boo");
    iVar2 = (*pMVar5->boolReturnValue)();
    if (iVar1 != iVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                 ,0xf6);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom((int)&local_30);
    pcVar8 = SimpleString::asCharString(&local_30);
    pMVar3 = mock_c();
    pMVar5 = (*pMVar3->actualCall)("boo");
    (*pMVar5->boolReturnValue)();
    ::StringFrom((int)&local_40);
    pcVar9 = SimpleString::asCharString(&local_40);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0xf6,pTVar7);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
  }
  pMVar3 = mock_c();
  iVar1 = (*pMVar3->boolReturnValue)();
  if (iVar1 == 1) {
    pUVar6 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0xe])
              (pUVar6,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0xf7,pTVar7);
  }
  else {
    pMVar3 = mock_c();
    iVar1 = (*pMVar3->boolReturnValue)();
    pMVar3 = mock_c();
    iVar2 = (*pMVar3->boolReturnValue)();
    if (iVar1 != iVar2) {
      pUVar6 = UtestShell::getCurrent();
      (*pUVar6->_vptr_UtestShell[0x1c])
                (pUVar6,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                 ,0xf7);
    }
    pUVar6 = UtestShell::getCurrent();
    ::StringFrom((int)&local_30);
    pcVar8 = SimpleString::asCharString(&local_30);
    pMVar3 = mock_c();
    (*pMVar3->boolReturnValue)();
    ::StringFrom((int)&local_40);
    pcVar9 = SimpleString::asCharString(&local_40);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar6->_vptr_UtestShell[0x16])
              (pUVar6,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
               ,0xf7,pTVar7);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_30);
  }
  pUVar6 = UtestShell::getCurrent();
  pMVar3 = mock_c();
  MVar10 = (*pMVar3->returnValue)();
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar6->_vptr_UtestShell[0xe])
            (pUVar6,0,(ulong)MVar10.type,
             "LONGS_EQUAL(MOCKVALUETYPE_BOOL, mock_c()->returnValue().type) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0xf8,pTVar7);
  return;
}

Assistant:

TEST(MockSupport_c, returnBoolValue)
{
    int expected_value = 1;
    mock_c()->expectOneCall("boo")->andReturnBoolValue(expected_value);
    CHECK_EQUAL(expected_value, mock_c()->actualCall("boo")->boolReturnValue());
    CHECK_EQUAL(expected_value, mock_c()->boolReturnValue());
    LONGS_EQUAL(MOCKVALUETYPE_BOOL, mock_c()->returnValue().type);
}